

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Segment::CopyAndMoveCuesBeforeClusters
          (Segment *this,IMkvReader *reader,IMkvWriter *writer)

{
  bool bVar1;
  uint uVar2;
  int32 iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t segment_size;
  int64_t pos;
  int64_t cluster_offset;
  IMkvWriter *writer_local;
  IMkvReader *reader_local;
  Segment *this_local;
  
  uVar2 = (*writer->_vptr_IMkvWriter[3])();
  if (((uVar2 & 1) == 0) || ((this->chunking_ & 1U) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    iVar7 = Cluster::size_position(*this->cluster_list_);
    iVar3 = GetUIntSize(0x1f43b675);
    lVar8 = iVar7 - iVar3;
    bVar1 = ChunkedCopy(reader,writer,0,lVar8);
    if (bVar1) {
      MoveCuesBeforeClusters(this);
      bVar1 = Cues::Write(&this->cues_,writer);
      if ((bVar1) && (bVar1 = SeekHead::Finalize(&this->seek_head_,writer), bVar1)) {
        bVar1 = ChunkedCopy(reader,writer,lVar8,this->cluster_end_offset_ - lVar8);
        if (bVar1) {
          iVar4 = (*writer->_vptr_IMkvWriter[1])();
          iVar5 = (*writer->_vptr_IMkvWriter[1])();
          lVar8 = this->payload_pos_;
          iVar6 = (*writer->_vptr_IMkvWriter[2])(writer,this->size_position_);
          if (((iVar6 == 0) &&
              (iVar3 = WriteUIntSize(writer,CONCAT44(extraout_var_00,iVar5) - lVar8,8), iVar3 == 0))
             && (iVar4 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar4)),
                iVar4 == 0)) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::CopyAndMoveCuesBeforeClusters(mkvparser::IMkvReader* reader,
                                            IMkvWriter* writer) {
  if (!writer->Seekable() || chunking_)
    return false;
  const int64_t cluster_offset =
      cluster_list_[0]->size_position() - GetUIntSize(libwebm::kMkvCluster);

  // Copy the headers.
  if (!ChunkedCopy(reader, writer, 0, cluster_offset))
    return false;

  // Recompute cue positions and seek entries.
  MoveCuesBeforeClusters();

  // Write cues and seek entries.
  // TODO(vigneshv): As of now, it's safe to call seek_head_.Finalize() for the
  // second time with a different writer object. But the name Finalize() doesn't
  // indicate something we want to call more than once. So consider renaming it
  // to write() or some such.
  if (!cues_.Write(writer) || !seek_head_.Finalize(writer))
    return false;

  // Copy the Clusters.
  if (!ChunkedCopy(reader, writer, cluster_offset,
                   cluster_end_offset_ - cluster_offset))
    return false;

  // Update the Segment size in case the Cues size has changed.
  const int64_t pos = writer->Position();
  const int64_t segment_size = writer->Position() - payload_pos_;
  if (writer->Position(size_position_) ||
      WriteUIntSize(writer, segment_size, 8) || writer->Position(pos))
    return false;
  return true;
}